

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_BrowseResult *
UA_Server_browseNext
          (UA_BrowseResult *__return_storage_ptr__,UA_Server *server,
          UA_Boolean releaseContinuationPoint,UA_ByteString *continuationPoint)

{
  (__return_storage_ptr__->continuationPoint).data = (UA_Byte *)0x0;
  __return_storage_ptr__->referencesSize = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->continuationPoint).length = 0;
  __return_storage_ptr__->references = (UA_ReferenceDescription *)0x0;
  UA_Server_browseNext_single
            (server,&adminSession,releaseContinuationPoint,continuationPoint,__return_storage_ptr__)
  ;
  return __return_storage_ptr__;
}

Assistant:

UA_BrowseResult
UA_Server_browseNext(UA_Server *server, UA_Boolean releaseContinuationPoint,
                     const UA_ByteString *continuationPoint) {
    UA_BrowseResult result;
    UA_BrowseResult_init(&result);
    UA_RCU_LOCK();
    UA_Server_browseNext_single(server, &adminSession, releaseContinuationPoint,
                                continuationPoint, &result);
    UA_RCU_UNLOCK();
    return result;
}